

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O2

int coda_ascbin_cursor_goto_attributes(coda_cursor *cursor)

{
  long *plVar1;
  int iVar2;
  coda_dynamic_type_struct *pcVar3;
  coda_type_record *pcVar4;
  coda_backend format;
  
  pcVar3 = cursor->stack[(long)cursor->n + -1].type;
  format = pcVar3->backend;
  if (99 < format) {
    format = pcVar3->definition->format;
  }
  cursor->n = cursor->n + 1;
  pcVar4 = coda_type_empty_record(format);
  iVar2 = cursor->n;
  cursor->stack[(long)iVar2 + -1].type = (coda_dynamic_type_struct *)pcVar4;
  plVar1 = &cursor->stack[(long)iVar2 + -1].index;
  *(undefined4 *)plVar1 = 0xffffffff;
  *(undefined4 *)((long)plVar1 + 4) = 0xffffffff;
  *(undefined4 *)(plVar1 + 1) = 0xffffffff;
  *(undefined4 *)((long)plVar1 + 0xc) = 0xffffffff;
  return 0;
}

Assistant:

int coda_ascbin_cursor_goto_attributes(coda_cursor *cursor)
{
    coda_format format = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type)->format;

    cursor->n++;
    cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)coda_type_empty_record(format);
    /* we use the special index value '-1' to indicate that we are pointing to the attributes of the parent */
    cursor->stack[cursor->n - 1].index = -1;
    cursor->stack[cursor->n - 1].bit_offset = -1;       /* virtual types do not have a bit offset */

    return 0;
}